

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

void Ssw_ManLabelPiNodes(Ssw_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_28;
  int local_24;
  int i;
  int f;
  Aig_Obj_t *pObjFrames;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  pAVar2 = Aig_ManConst1(p->pFrames);
  *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
  pAVar2 = Aig_ManConst1(p->pFrames);
  *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffdf | 0x20;
  local_24 = 0;
  do {
    if (p->nFrames <= local_24) {
      return;
    }
    for (local_28 = 0; iVar1 = Saig_ManPiNum(p->pAig), local_28 < iVar1; local_28 = local_28 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_28);
      pAVar2 = Ssw_ObjFrame(p,pAVar2,local_24);
      iVar1 = Aig_ObjIsCi(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsCi(pObjFrames)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0x39,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
      }
      if ((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) != 0) {
        __assert_fail("pObjFrames->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0x3a,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
      }
      *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
      *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Label PIs nodes of the frames corresponding to PIs of AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManLabelPiNodes( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFrames;
    int f, i;
    Aig_ManConst1( p->pFrames )->fMarkA = 1;
    Aig_ManConst1( p->pFrames )->fMarkB = 1;
    for ( f = 0; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrames = Ssw_ObjFrame( p, pObj, f );
            assert( Aig_ObjIsCi(pObjFrames) );
            assert( pObjFrames->fMarkB == 0 );
            pObjFrames->fMarkA = 1;
            pObjFrames->fMarkB = 1;
        }
    }
}